

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaUtil.cpp
# Opt level: O0

DomainSet * consensusDomains(WeightedDomainEnsemble *dEnsemble)

{
  type_conflict3 tVar1;
  bool bVar2;
  reference ppVar3;
  reference pWVar4;
  integer_iterator<unsigned_long> this;
  vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
  *in_RSI;
  IntervalScheduler *in_RDI;
  WeightedInterval ival;
  iterator __end1_2;
  iterator __begin1_2;
  Intervals *__range1_2;
  IntervalScheduler scheduler;
  double persistence;
  Domain domain_1;
  pair<const_Domain,_double> domainPersistence;
  iterator __end1_1;
  iterator __begin1_1;
  PersistenceMap *__range1_1;
  Intervals ivals;
  Domain *domain;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  value_type *dSet_1;
  reference dSetIdx;
  integer_iterator<unsigned_long> __end1;
  integer_iterator<unsigned_long> __begin1;
  integer_range<unsigned_long> *__range1;
  PersistenceMap pmap;
  DomainSet *dSet;
  value_type *in_stack_fffffffffffffdb8;
  IntervalScheduler *in_stack_fffffffffffffdc0;
  __normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>
  in_stack_fffffffffffffdc8;
  __normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>
  in_stack_fffffffffffffdd0;
  IntervalScheduler *this_00;
  Domain local_1e0;
  undefined8 local_1c8;
  double dStack_1c0;
  WeightedInterval *local_1b8;
  __normal_iterator<WeightedInterval_*,_std::vector<WeightedInterval,_std::allocator<WeightedInterval>_>_>
  local_1b0;
  undefined1 local_1a8 [24];
  undefined1 *local_190;
  undefined1 local_181;
  Intervals *in_stack_fffffffffffffe88;
  IntervalScheduler *in_stack_fffffffffffffe90;
  WeightedInterval local_130;
  double local_120;
  size_t local_118;
  size_t sStack_110;
  undefined8 local_108;
  size_t local_f8;
  size_t sStack_f0;
  undefined8 local_e8;
  double dStack_e0;
  _Self local_d8;
  _Self local_d0;
  undefined1 *local_c8;
  reference local_a8;
  Domain *local_a0;
  __normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_> local_98;
  reference local_90;
  reference local_88;
  Domain *local_80;
  value_type local_78;
  value_type local_70;
  iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
  local_58;
  iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
  *local_48;
  undefined1 local_40 [48];
  vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
  *local_10;
  
  this_00 = in_RDI;
  local_10 = in_RSI;
  std::map<Domain,_double,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_>::
  map((map<Domain,_double,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_> *)
      0x1df6e1);
  std::
  vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
  ::size(local_10);
  local_58 = (iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
              )boost::irange<unsigned_long>
                         ((unsigned_long)in_stack_fffffffffffffdc0,
                          (unsigned_long)in_stack_fffffffffffffdb8);
  this = local_58.m_End.m_value;
  local_48 = &local_58;
  local_70 = (value_type)
             boost::iterator_range_detail::
             iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
             ::begin(local_48);
  local_78 = (value_type)
             boost::iterator_range_detail::
             iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
             ::end(local_48);
  while( true ) {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                        *)in_stack_fffffffffffffdd0._M_current,
                       (iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                        *)in_stack_fffffffffffffdc8._M_current);
    if (!tVar1) break;
    in_stack_fffffffffffffdd0._M_current =
         (Domain *)
         boost::iterators::detail::
         iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
         ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                      *)0x1df7a7);
    local_80 = in_stack_fffffffffffffdd0._M_current;
    local_90 = std::
               vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
               ::operator[](local_10,(size_type)in_stack_fffffffffffffdd0._M_current);
    local_88 = local_90;
    local_98._M_current =
         (Domain *)
         std::vector<Domain,_std::allocator<Domain>_>::begin
                   ((vector<Domain,_std::allocator<Domain>_> *)in_stack_fffffffffffffdb8);
    local_a0 = (Domain *)
               std::vector<Domain,_std::allocator<Domain>_>::end
                         ((vector<Domain,_std::allocator<Domain>_> *)in_stack_fffffffffffffdb8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>
                          *)in_stack_fffffffffffffdc0,
                         (__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>
                          *)in_stack_fffffffffffffdb8);
      if (!bVar2) break;
      local_a8 = __gnu_cxx::
                 __normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>::
                 operator*(&local_98);
      in_stack_fffffffffffffdc0 = (IntervalScheduler *)(double)local_a8->weight;
      in_stack_fffffffffffffdc8._M_current =
           (Domain *)
           std::
           map<Domain,_double,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_>
           ::operator[]((map<Domain,_double,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_>
                         *)this.m_value,(key_type *)this_00);
      (in_stack_fffffffffffffdc8._M_current)->start = (size_t)in_stack_fffffffffffffdc0;
      __gnu_cxx::__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>::
      operator++(&local_98);
    }
    boost::iterators::detail::
    iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                  *)in_stack_fffffffffffffdc0);
  }
  std::vector<WeightedInterval,_std::allocator<WeightedInterval>_>::vector
            ((vector<WeightedInterval,_std::allocator<WeightedInterval>_> *)0x1df8c7);
  local_c8 = local_40;
  local_d0._M_node =
       (_Base_ptr)
       std::
       map<Domain,_double,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_>::
       begin((map<Domain,_double,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_>
              *)in_stack_fffffffffffffdb8);
  local_d8._M_node =
       (_Base_ptr)
       std::
       map<Domain,_double,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_>::
       end((map<Domain,_double,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_>
            *)in_stack_fffffffffffffdb8);
  while( true ) {
    bVar2 = std::operator!=(&local_d0,&local_d8);
    if (!bVar2) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Domain,_double>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_Domain,_double>_> *)0x1df92c);
    local_118 = (ppVar3->first).start;
    sStack_110 = (ppVar3->first).end;
    local_108 = *(undefined8 *)&(ppVar3->first).weight;
    local_120 = ppVar3->second;
    local_f8 = local_118;
    sStack_f0 = sStack_110;
    local_e8 = local_108;
    dStack_e0 = local_120;
    WeightedInterval::WeightedInterval(&local_130,(int)local_118,(int)sStack_110,local_120);
    std::vector<WeightedInterval,_std::allocator<WeightedInterval>_>::push_back
              ((vector<WeightedInterval,_std::allocator<WeightedInterval>_> *)
               in_stack_fffffffffffffdc0,(value_type *)in_stack_fffffffffffffdb8);
    std::_Rb_tree_iterator<std::pair<const_Domain,_double>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_Domain,_double>_> *)in_stack_fffffffffffffdc0);
  }
  IntervalScheduler::IntervalScheduler(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  IntervalScheduler::computeSchedule(in_RDI);
  local_181 = 0;
  std::vector<Domain,_std::allocator<Domain>_>::vector
            ((vector<Domain,_std::allocator<Domain>_> *)0x1dfa17);
  IntervalScheduler::extractIntervals(this_00);
  local_190 = local_1a8;
  local_1b0._M_current =
       (WeightedInterval *)
       std::vector<WeightedInterval,_std::allocator<WeightedInterval>_>::begin
                 ((vector<WeightedInterval,_std::allocator<WeightedInterval>_> *)
                  in_stack_fffffffffffffdb8);
  local_1b8 = (WeightedInterval *)
              std::vector<WeightedInterval,_std::allocator<WeightedInterval>_>::end
                        ((vector<WeightedInterval,_std::allocator<WeightedInterval>_> *)
                         in_stack_fffffffffffffdb8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<WeightedInterval_*,_std::vector<WeightedInterval,_std::allocator<WeightedInterval>_>_>
                        *)in_stack_fffffffffffffdc0,
                       (__normal_iterator<WeightedInterval_*,_std::vector<WeightedInterval,_std::allocator<WeightedInterval>_>_>
                        *)in_stack_fffffffffffffdb8);
    if (!bVar2) break;
    pWVar4 = __gnu_cxx::
             __normal_iterator<WeightedInterval_*,_std::vector<WeightedInterval,_std::allocator<WeightedInterval>_>_>
             ::operator*(&local_1b0);
    local_1c8._0_4_ = pWVar4->start;
    local_1c8._4_4_ = pWVar4->end;
    dStack_1c0 = pWVar4->score;
    Domain::Domain(&local_1e0,(long)(int)(undefined4)local_1c8,(long)(int)local_1c8._4_4_);
    std::vector<Domain,_std::allocator<Domain>_>::push_back
              ((vector<Domain,_std::allocator<Domain>_> *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
    __gnu_cxx::
    __normal_iterator<WeightedInterval_*,_std::vector<WeightedInterval,_std::allocator<WeightedInterval>_>_>
    ::operator++(&local_1b0);
  }
  std::vector<WeightedInterval,_std::allocator<WeightedInterval>_>::~vector
            ((vector<WeightedInterval,_std::allocator<WeightedInterval>_> *)
             in_stack_fffffffffffffdd0._M_current);
  std::vector<Domain,_std::allocator<Domain>_>::begin
            ((vector<Domain,_std::allocator<Domain>_> *)in_stack_fffffffffffffdb8);
  std::vector<Domain,_std::allocator<Domain>_>::end
            ((vector<Domain,_std::allocator<Domain>_> *)in_stack_fffffffffffffdb8);
  std::sort<__gnu_cxx::__normal_iterator<Domain*,std::vector<Domain,std::allocator<Domain>>>>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_181 = 1;
  IntervalScheduler::~IntervalScheduler(in_stack_fffffffffffffdc0);
  std::vector<WeightedInterval,_std::allocator<WeightedInterval>_>::~vector
            ((vector<WeightedInterval,_std::allocator<WeightedInterval>_> *)
             in_stack_fffffffffffffdd0._M_current);
  std::map<Domain,_double,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_>::
  ~map((map<Domain,_double,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_> *)
       0x1dfbb3);
  return (DomainSet *)this_00;
}

Assistant:

DomainSet consensusDomains(WeightedDomainEnsemble& dEnsemble) {
    using PersistenceMap = map<Domain, double>;
    PersistenceMap pmap;

    for (auto dSetIdx : boost::irange(size_t{0}, dEnsemble.domainSets.size())) {
        auto& dSet = dEnsemble.domainSets[dSetIdx];
        for (auto& domain : dSet) {
            pmap[domain] = domain.weight;
        }
    }

    Intervals ivals;

    for (auto domainPersistence : pmap) {
        auto domain = domainPersistence.first;
        auto persistence = domainPersistence.second;
        ivals.push_back(WeightedInterval(domain.start, domain.end, persistence));
    }

    IntervalScheduler scheduler(ivals);
    scheduler.computeSchedule();

    DomainSet dSet;
    for (auto ival : scheduler.extractIntervals()) {
        dSet.push_back(Domain(ival.start, ival.end));
    }

    sort(dSet.begin(), dSet.end());

    return dSet;
}